

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chart.cpp
# Opt level: O0

pair<int,_int> __thiscall
Chart::determineHourRange
          (Chart *this,Range *range,vector<Interval,_std::allocator<Interval>_> *tracked)

{
  vector<Interval,_std::allocator<Interval>_> *this_00;
  bool bVar1;
  int iVar2;
  int *piVar3;
  int local_294 [3];
  int local_288;
  int local_284;
  undefined1 local_280 [8];
  Interval clipped;
  undefined1 local_1b0 [8];
  Interval test;
  Interval *track;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Interval,_std::allocator<Interval>_> *__range2;
  Range day_range;
  Datetime day;
  int last_hour;
  int first_hour;
  vector<Interval,_std::allocator<Interval>_> *local_28;
  vector<Interval,_std::allocator<Interval>_> *tracked_local;
  Range *range_local;
  Chart *this_local;
  
  local_28 = tracked;
  tracked_local = (vector<Interval,_std::allocator<Interval>_> *)range;
  range_local = (Range *)this;
  bVar1 = std::vector<Interval,_std::allocator<Interval>_>::empty(tracked);
  if (bVar1) {
    first_hour = 0;
    last_hour = 0x17;
    this_local = (Chart *)std::make_pair<int,int>(&first_hour,&last_hour);
  }
  else {
    day._date._4_4_ = 0x17;
    day._date._0_4_ = 0;
    memcpy(&day_range.end._date,
           &(tracked_local->super__Vector_base<Interval,_std::allocator<Interval>_>)._M_impl.
            super__Vector_impl_data._M_finish,0x30);
    while (bVar1 = Datetime::operator<((Datetime *)&day_range.end._date,
                                       (Datetime *)
                                       &tracked_local[2].
                                        super__Vector_base<Interval,_std::allocator<Interval>_>.
                                        _M_impl.super__Vector_impl_data._M_finish), bVar1) {
      getFullDay((Range *)&__range2,(Datetime *)&day_range.end._date);
      this_00 = local_28;
      __end2 = std::vector<Interval,_std::allocator<Interval>_>::begin(local_28);
      track = (Interval *)std::vector<Interval,_std::allocator<Interval>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                                         *)&track), bVar1) {
        test._tags._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)__gnu_cxx::
                     __normal_iterator<const_Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                     ::operator*(&__end2);
        Interval::Interval((Interval *)local_1b0,
                           (Interval *)test._tags._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar1 = Range::is_open((Range *)local_1b0);
        if (bVar1) {
          memcpy(&test.super_Range.start._date,this,0x30);
        }
        bVar1 = Range::overlaps((Range *)&__range2,(Range *)local_1b0);
        if (bVar1) {
          clip((Interval *)local_280,(Interval *)local_1b0,(Range *)&__range2);
          iVar2 = Datetime::hour((Datetime *)&clipped);
          if (iVar2 < day._date._4_4_) {
            day._date._4_4_ = Datetime::hour((Datetime *)&clipped);
          }
          bVar1 = Range::is_open((Range *)local_280);
          if ((!bVar1) &&
             (iVar2 = Datetime::hour((Datetime *)&clipped.super_Range.start._date),
             (int)day._date < iVar2)) {
            day._date._0_4_ = Datetime::hour((Datetime *)&clipped.super_Range.start._date);
          }
          Interval::~Interval((Interval *)local_280);
        }
        Interval::~Interval((Interval *)local_1b0);
        __gnu_cxx::
        __normal_iterator<const_Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>::
        operator++(&__end2);
      }
      Range::~Range((Range *)&__range2);
      Datetime::operator++((Datetime *)&day_range.end._date,0);
    }
    if ((day._date._4_4_ == 0x17) && ((int)day._date == 0)) {
      day._date._4_4_ = this->reference_hour;
      local_284 = day._date._4_4_ + 1;
      local_288 = 0x17;
      piVar3 = std::min<int>(&local_284,&local_288);
      day._date._0_4_ = *piVar3;
    }
    else {
      local_294[2] = day._date._4_4_ + -1;
      local_294[1] = 0;
      piVar3 = std::max<int>(local_294 + 2,local_294 + 1);
      day._date._4_4_ = *piVar3;
      local_294[0] = 0x17;
      piVar3 = std::min<int>((int *)&day._date,local_294);
      day._date._0_4_ = *piVar3;
    }
    this_local = (Chart *)std::make_pair<int&,int&>((int *)((long)&day._date + 4),(int *)&day._date)
    ;
  }
  return (pair<int,_int>)this_local;
}

Assistant:

std::pair <int, int> Chart::determineHourRange (
  const Range& range,
  const std::vector <Interval>& tracked)
{
  // If there is no data, show the whole day.
  if (tracked.empty ())
  {
    return std::make_pair (0, 23);
  }

  // Get the extreme time range for the filtered data.
  auto first_hour = 23;
  auto last_hour = 0;

  for (Datetime day = range.start; day < range.end; day++)
  {
    auto day_range = getFullDay (day);

    for (auto& track : tracked)
    {
      Interval test {track};

      if (test.is_open ())
      {
        test.end = reference_datetime;
      }

      if (day_range.overlaps (test))
      {
        Interval clipped = clip (test, day_range);

        if (clipped.start.hour () < first_hour)
        {
          first_hour = clipped.start.hour ();
        }

        if (! clipped.is_open () && clipped.end.hour () > last_hour)
        {
          last_hour = clipped.end.hour ();
        }
      }
    }
  }

  if (first_hour == 23 && last_hour == 0)
  {
    first_hour = reference_hour;
    last_hour = std::min (first_hour + 1, 23);
  }
  else
  {
    first_hour = std::max (first_hour - 1, 0);
    last_hour = std::min (last_hour, 23);
  }

  return std::make_pair (first_hour, last_hour);
}